

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_deserializer.cpp
# Opt level: O3

void __thiscall
duckdb::BinaryDeserializer::OnPropertyBegin
          (BinaryDeserializer *this,field_id_t field_id,char *param_2)

{
  SerializationException *this_00;
  field_id_t params_1;
  unsigned_short value;
  string local_48;
  
  if (this->has_buffered_field == true) {
    this->has_buffered_field = false;
    params_1 = this->buffered_field;
  }
  else {
    (**this->stream->_vptr_ReadStream)(this->stream,&local_48,2);
    params_1 = (unsigned_short)local_48._M_dataplus._M_p;
  }
  if (params_1 == field_id) {
    return;
  }
  this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Failed to deserialize: field id mismatch, expected: %d, got: %d",
             "");
  SerializationException::SerializationException<unsigned_short,unsigned_short>
            (this_00,&local_48,field_id,params_1);
  __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BinaryDeserializer::OnPropertyBegin(const field_id_t field_id, const char *) {
	auto field = NextField();
	if (field != field_id) {
		throw SerializationException("Failed to deserialize: field id mismatch, expected: %d, got: %d", field_id,
		                             field);
	}
}